

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

EventLoop * __thiscall kj::Executor::getLoop(Executor *this)

{
  Impl *pIVar1;
  State *maybe;
  EventLoop *pEVar2;
  char (*in_RCX) [33];
  String local_1f0;
  Exception local_1d8;
  EventLoop *l;
  EventLoop *local_18;
  EventLoop *_l1351;
  Executor *this_local;
  
  _l1351 = (EventLoop *)this;
  pIVar1 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&this->impl);
  MutexGuarded<kj::Executor::Impl::State>::lockShared
            ((MutexGuarded<kj::Executor::Impl::State> *)&stack0xffffffffffffffd8,pIVar1);
  maybe = Locked<const_kj::Executor::Impl::State>::operator->
                    ((Locked<const_kj::Executor::Impl::State> *)&stack0xffffffffffffffd8);
  pEVar2 = kj::_::readMaybe<kj::EventLoop>(&maybe->loop);
  Locked<const_kj::Executor::Impl::State>::~Locked
            ((Locked<const_kj::Executor::Impl::State> *)&stack0xffffffffffffffd8);
  if (pEVar2 != (EventLoop *)0x0) {
    return pEVar2;
  }
  local_18 = pEVar2;
  kj::_::Debug::makeDescription<char_const(&)[33]>
            (&local_1f0,(Debug *)"\"Executor\'s event loop has exited\"",
             "Executor\'s event loop has exited",in_RCX);
  Exception::Exception
            (&local_1d8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x54a,&local_1f0);
  throwFatalException(&local_1d8,0);
}

Assistant:

EventLoop& Executor::getLoop() const {
  KJ_IF_SOME(l, impl->state.lockShared()->loop) {
    return l;
  } else {
    kj::throwFatalException(KJ_EXCEPTION(DISCONNECTED, "Executor's event loop has exited"));
  }
}